

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QPagedPaintDevice::PdfVersion,QPdfEngine::PdfVersion>::emplace<QPdfEngine::PdfVersion_const&>
          (QHash<QPagedPaintDevice::PdfVersion,_QPdfEngine::PdfVersion> *this,PdfVersion *key,
          PdfVersion *args)

{
  long lVar1;
  bool bVar2;
  PdfVersion *in_RDX;
  QHash<QPagedPaintDevice::PdfVersion,_QPdfEngine::PdfVersion> *in_RSI;
  PdfVersion *in_RDI;
  long in_FS_OFFSET;
  iterator iVar3;
  QHash<QPagedPaintDevice::PdfVersion,_QPdfEngine::PdfVersion> copy;
  QHash<QPagedPaintDevice::PdfVersion,_QPdfEngine::PdfVersion> *in_stack_ffffffffffffffa8;
  QHash<QPagedPaintDevice::PdfVersion,_QPdfEngine::PdfVersion> *in_stack_ffffffffffffffb0;
  undefined1 local_28 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QHash<QPagedPaintDevice::PdfVersion,_QPdfEngine::PdfVersion>::isDetached
                    (in_stack_ffffffffffffffb0);
  if (bVar2) {
    bVar2 = QHashPrivate::
            Data<QHashPrivate::Node<QPagedPaintDevice::PdfVersion,_QPdfEngine::PdfVersion>_>::
            shouldGrow(*(Data<QHashPrivate::Node<QPagedPaintDevice::PdfVersion,_QPdfEngine::PdfVersion>_>
                         **)in_RDI);
    if (bVar2) {
      local_28 = (undefined1  [16])
                 QHash<QPagedPaintDevice::PdfVersion,_QPdfEngine::PdfVersion>::
                 emplace_helper<QPdfEngine::PdfVersion>(in_RSI,in_RDX,in_RDI);
    }
    else {
      local_28 = (undefined1  [16])
                 emplace_helper<QPdfEngine::PdfVersion_const&>(in_RSI,in_RDX,in_RDI);
    }
  }
  else {
    QHash<QPagedPaintDevice::PdfVersion,_QPdfEngine::PdfVersion>::QHash
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    QHash<QPagedPaintDevice::PdfVersion,_QPdfEngine::PdfVersion>::detach(in_stack_ffffffffffffffb0);
    local_28 = (undefined1  [16])emplace_helper<QPdfEngine::PdfVersion_const&>(in_RSI,in_RDX,in_RDI)
    ;
    QHash<QPagedPaintDevice::PdfVersion,_QPdfEngine::PdfVersion>::~QHash(in_stack_ffffffffffffffb0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    iVar3.i.d = (Data<QHashPrivate::Node<QPagedPaintDevice::PdfVersion,_QPdfEngine::PdfVersion>_> *)
                local_28._0_8_;
    iVar3.i.bucket = local_28._8_8_;
    return (iterator)iVar3.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }